

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::D3MFExporter::writeBaseMaterials(D3MFExporter *this)

{
  aiMaterial *pMat;
  size_type sVar1;
  aiReturn aVar2;
  aiScene *paVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string tmp;
  string hexDiffuseColor;
  string strName;
  aiColor4D color;
  aiString name;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined1 local_6a8;
  undefined7 uStack_6a7;
  undefined1 *local_698;
  char *local_690;
  undefined1 local_688;
  undefined7 uStack_687;
  long *local_678;
  long local_670;
  long local_668;
  long lStack_660;
  long *local_658;
  long local_650;
  long local_648;
  long lStack_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  aiColor4D local_618;
  ostream *local_608;
  ulong local_600;
  long *local_5f8;
  long local_5f0;
  long local_5e8;
  long lStack_5e0;
  D3MFExporter *local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  string local_5b0 [3];
  ios_base local_540 [268];
  aiString local_434;
  
  local_608 = (ostream *)&this->mModelOutput;
  std::__ostream_insert<char,std::char_traits<char>>(local_608,"<basematerials id=\"1\">\n",0x17);
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  local_638._M_string_length = 0;
  local_638.field_2._M_local_buf[0] = '\0';
  local_698 = &local_688;
  local_690 = (char *)0x0;
  local_688 = 0;
  local_6b8 = &local_6a8;
  local_6b0 = 0;
  local_6a8 = 0;
  paVar3 = this->mScene;
  local_5d8 = this;
  if (paVar3->mNumMaterials != 0) {
    uVar7 = 0;
    do {
      pMat = paVar3->mMaterials[uVar7];
      local_434.length = 0;
      local_434.data[0] = '\0';
      local_600 = uVar7;
      memset(local_434.data + 1,0x1b,0x3ff);
      aVar2 = aiGetMaterialString(pMat,"?mat.name",0,0,&local_434);
      sVar1 = local_638._M_string_length;
      if (aVar2 == aiReturn_SUCCESS) {
        strlen(local_434.data);
        std::__cxx11::string::_M_replace((ulong)&local_638,0,(char *)sVar1,(ulong)local_434.data);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
        std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
        std::ios_base::~ios_base(local_540);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_658,0,(char *)0x0,0x6b564c);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_668 = *plVar5;
          lStack_660 = plVar4[3];
          local_678 = &local_668;
        }
        else {
          local_668 = *plVar5;
          local_678 = (long *)*plVar4;
        }
        local_670 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_638,(string *)&local_678);
        if (local_678 != &local_668) {
          operator_delete(local_678,local_668 + 1);
        }
        if (local_658 != &local_648) {
          operator_delete(local_658,local_648 + 1);
        }
      }
      paVar8 = &local_5b0[0].field_2;
      local_618.r = 0.0;
      local_618.g = 0.0;
      local_618.b = 0.0;
      local_618.a = 0.0;
      aVar2 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,&local_618);
      if (aVar2 == aiReturn_SUCCESS) {
        local_690 = (char *)0x0;
        *local_698 = 0;
        local_6b0 = 0;
        *local_6b8 = 0;
        std::__cxx11::string::_M_replace((ulong)&local_698,0,local_690,0x6b61f5);
        DecimalToHexa<float>(local_5b0,local_618.r);
        std::__cxx11::string::operator=((string *)&local_6b8,(string *)local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar8) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_698,(ulong)local_6b8);
        DecimalToHexa<float>(local_5b0,local_618.g);
        std::__cxx11::string::operator=((string *)&local_6b8,(string *)local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar8) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_698,(ulong)local_6b8);
        DecimalToHexa<float>(local_5b0,local_618.b);
        std::__cxx11::string::operator=((string *)&local_6b8,(string *)local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar8) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_698,(ulong)local_6b8);
        DecimalToHexa<float>(local_5b0,local_618.a);
        std::__cxx11::string::operator=((string *)&local_6b8,(string *)local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar8) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_698,(ulong)local_6b8);
      }
      else {
        std::__cxx11::string::_M_replace((ulong)&local_698,0,local_690,0x6b5655);
      }
      std::operator+(&local_5d0,"<base name=\"",&local_638);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_5d0);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_5e8 = *plVar5;
        lStack_5e0 = plVar4[3];
        local_5f8 = &local_5e8;
      }
      else {
        local_5e8 = *plVar5;
        local_5f8 = (long *)*plVar4;
      }
      local_5f0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_5f8);
      local_658 = &local_648;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_648 = *plVar5;
        lStack_640 = plVar4[3];
      }
      else {
        local_648 = *plVar5;
        local_658 = (long *)*plVar4;
      }
      local_650 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_658,(ulong)local_698);
      local_678 = &local_668;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_668 = *plVar5;
        lStack_660 = plVar4[3];
      }
      else {
        local_668 = *plVar5;
        local_678 = (long *)*plVar4;
      }
      local_670 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_678);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_5b0[0].field_2._0_8_ = *psVar6;
        local_5b0[0].field_2._8_8_ = plVar4[3];
        local_5b0[0]._M_dataplus._M_p = (pointer)paVar8;
      }
      else {
        local_5b0[0].field_2._0_8_ = *psVar6;
        local_5b0[0]._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_5b0[0]._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_608,local_5b0[0]._M_dataplus._M_p,local_5b0[0]._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0[0]._M_dataplus._M_p != paVar8) {
        operator_delete(local_5b0[0]._M_dataplus._M_p,local_5b0[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_678 != &local_668) {
        operator_delete(local_678,local_668 + 1);
      }
      if (local_658 != &local_648) {
        operator_delete(local_658,local_648 + 1);
      }
      if (local_5f8 != &local_5e8) {
        operator_delete(local_5f8,local_5e8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
        operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
      }
      uVar7 = local_600 + 1;
      paVar3 = local_5d8->mScene;
    } while (uVar7 < paVar3->mNumMaterials);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_608,"</basematerials>\n",0x11);
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8,CONCAT71(uStack_6a7,local_6a8) + 1);
  }
  if (local_698 != &local_688) {
    operator_delete(local_698,CONCAT71(uStack_687,local_688) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,
                    CONCAT71(local_638.field_2._M_allocated_capacity._1_7_,
                             local_638.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void D3MFExporter::writeBaseMaterials() {
    mModelOutput << "<basematerials id=\"1\">\n";
    std::string strName, hexDiffuseColor , tmp;
    for ( size_t i = 0; i < mScene->mNumMaterials; ++i ) {
        aiMaterial *mat = mScene->mMaterials[ i ];
        aiString name;
        if ( mat->Get( AI_MATKEY_NAME, name ) != aiReturn_SUCCESS ) {
            strName = "basemat_" + to_string( i );
        } else {
            strName = name.C_Str();
        }
        aiColor4D color;
        if ( mat->Get( AI_MATKEY_COLOR_DIFFUSE, color ) == aiReturn_SUCCESS ) {
            hexDiffuseColor.clear();
            tmp.clear();
            hexDiffuseColor = "#";
            
            tmp = DecimalToHexa( color.r );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.g );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.b );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.a );
            hexDiffuseColor += tmp;
        } else {
            hexDiffuseColor = "#FFFFFFFF";
        }

        mModelOutput << "<base name=\""+strName+"\" "+" displaycolor=\""+hexDiffuseColor+"\" />\n";
    }
    mModelOutput << "</basematerials>\n";
}